

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O3

void btSoftRigidDynamicsWorld::rayTestSingle
               (btTransform *rayFromTrans,btTransform *rayToTrans,btCollisionObject *collisionObject
               ,btCollisionShape *collisionShape,btTransform *colObjWorldTransform,
               RayResultCallback *resultCallback)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  LocalShapeInfo shapeInfo;
  sRayCast softResult;
  undefined4 local_68;
  int local_64;
  sRayCast local_60;
  btCollisionObject *local_48;
  undefined1 *local_40;
  float local_38;
  float fStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  float local_28;
  
  if (collisionShape->m_shapeType == 0x20) {
    if ((collisionObject != (btCollisionObject *)0x0) && (collisionObject->m_internalType == 8)) {
      bVar3 = btSoftBody::rayTest((btSoftBody *)collisionObject,&rayFromTrans->m_origin,
                                  &rayToTrans->m_origin,&local_60);
      if ((bVar3) && (local_60.fraction <= resultCallback->m_closestHitFraction)) {
        local_68 = 0;
        local_64 = local_60.index;
        fVar4 = (rayToTrans->m_origin).m_floats[2] - (rayFromTrans->m_origin).m_floats[2];
        uVar1 = *(undefined8 *)(rayToTrans->m_origin).m_floats;
        uVar2 = *(undefined8 *)(rayFromTrans->m_origin).m_floats;
        fVar7 = (float)uVar1 - (float)uVar2;
        fVar8 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
        if (local_60.feature == Face) {
          uVar1 = *(undefined8 *)
                   (*(long *)&collisionObject[2].m_checkCollideWith + 0x28 +
                   (long)local_60.index * 0x48);
          local_38 = (float)uVar1;
          fStack_34 = (float)((ulong)uVar1 >> 0x20);
          uVar6 = *(ulong *)(*(long *)&collisionObject[2].m_checkCollideWith + 0x30 +
                            (long)local_60.index * 0x48);
          if (0.0 < fVar4 * (float)uVar6 + fVar7 * local_38 + fVar8 * fStack_34) {
            local_38 = -local_38;
            fStack_34 = -fStack_34;
            uVar6 = (ulong)(uint)-(float)uVar6;
          }
        }
        else {
          fVar5 = 1.0 / SQRT(fVar4 * fVar4 + fVar7 * fVar7 + fVar8 * fVar8);
          local_38 = fVar5 * -fVar7;
          fStack_34 = fVar5 * -fVar8;
          uVar6 = (ulong)(uint)(fVar5 * -fVar4);
        }
        uStack_30 = (undefined4)uVar6;
        uStack_2c = (undefined4)(uVar6 >> 0x20);
        local_28 = local_60.fraction;
        local_48 = collisionObject;
        local_40 = (undefined1 *)&local_68;
        (*resultCallback->_vptr_RayResultCallback[3])(resultCallback,&local_48,1);
      }
    }
    return;
  }
  btCollisionWorld::rayTestSingle
            (rayFromTrans,rayToTrans,collisionObject,collisionShape,colObjWorldTransform,
             resultCallback);
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::rayTestSingle(const btTransform& rayFromTrans,const btTransform& rayToTrans,
					  btCollisionObject* collisionObject,
					  const btCollisionShape* collisionShape,
					  const btTransform& colObjWorldTransform,
					  RayResultCallback& resultCallback)
{
	if (collisionShape->isSoftBody()) {
		btSoftBody* softBody = btSoftBody::upcast(collisionObject);
		if (softBody) {
			btSoftBody::sRayCast softResult;
			if (softBody->rayTest(rayFromTrans.getOrigin(), rayToTrans.getOrigin(), softResult)) 
			{
				
				if (softResult.fraction<= resultCallback.m_closestHitFraction)
				{

					btCollisionWorld::LocalShapeInfo shapeInfo;
					shapeInfo.m_shapePart = 0;
					shapeInfo.m_triangleIndex = softResult.index;
					// get the normal
					btVector3 rayDir = rayToTrans.getOrigin() - rayFromTrans.getOrigin();
					btVector3 normal=-rayDir;
					normal.normalize();

					if (softResult.feature == btSoftBody::eFeature::Face)
					{
						normal = softBody->m_faces[softResult.index].m_normal;
						if (normal.dot(rayDir) > 0) {
							// normal always point toward origin of the ray
							normal = -normal;
						}
					}
	
					btCollisionWorld::LocalRayResult rayResult
						(collisionObject,
						 &shapeInfo,
						 normal,
						 softResult.fraction);
					bool	normalInWorldSpace = true;
					resultCallback.addSingleResult(rayResult,normalInWorldSpace);
				}
			}
		}
	} 
	else {
		btCollisionWorld::rayTestSingle(rayFromTrans,rayToTrans,collisionObject,collisionShape,colObjWorldTransform,resultCallback);
	}
}